

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_register_operations.c
# Opt level: O3

void high_register_operations(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint32_t *puVar4;
  ulong uVar5;
  status_register_t *psVar6;
  long lVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  bool bVar13;
  
  uVar1 = thminstr->raw;
  uVar8 = uVar1 & 0x80;
  uVar9 = uVar1 >> 8 & 3;
  uVar2 = (uint)uVar1;
  if ((uVar1 & 0xc0) == 0) {
    if (uVar9 == 3) goto switchD_0010c6c3_caseD_3;
    if (uVar9 != 2) {
      if (uVar9 != 1) goto LAB_0010d0a4;
      high_register_operations_cold_3();
      goto LAB_0010d09a;
    }
LAB_0010d09f:
    high_register_operations_cold_2();
LAB_0010d0a4:
    high_register_operations_cold_4();
    uVar1 = thminstr->raw;
    uVar5 = (ulong)(uVar1 >> 8 & 7);
    if ((uVar1 >> 0xb & 1) == 0) {
      uVar2 = state->pc & 0xfffffffd;
    }
    else {
      uVar2 = ((state->cpsr).raw & 0x1f) - 0x11;
      lVar7 = 0x80;
      if (uVar2 < 0xb) {
        lVar7 = *(long *)(&DAT_00123f98 + (ulong)uVar2 * 8);
      }
      uVar2 = *(uint *)((long)state->r + lVar7 + -0x38);
    }
    uVar2 = (uint)(byte)uVar1 * 4 + uVar2;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",uVar5,(ulong)uVar2);
    }
    state->r[uVar5] = uVar2;
    return;
  }
  thminstr = (thumbinstr_t *)&switchD_0010c6c3::switchdataD_00123b90;
  switch(uVar9) {
  case 0:
    uVar12 = uVar8 >> 4 | uVar2 & 7;
    uVar10 = ((uVar2 & 0x40) >> 3 | 7) & (uint)(uVar1 >> 3);
    uVar8 = (state->cpsr).raw;
    uVar2 = uVar8 & 0x1f;
    if (uVar10 - 8 < 5 && uVar2 == 0x11) {
      puVar4 = state->highreg_fiq + (uVar10 - 8);
      goto LAB_0010cb09;
    }
    if ((ushort)uVar10 < 0xd) {
      puVar4 = state->r + uVar10;
      goto LAB_0010cb09;
    }
    if ((ushort)uVar10 != 0xe) {
      if (uVar10 != 0xd) {
        puVar4 = &state->pc;
        goto LAB_0010cb09;
      }
      switch(uVar2) {
      case 0x11:
        puVar4 = &state->sp_fiq;
        goto LAB_0010cb09;
      case 0x12:
        lVar7 = 0x90;
        break;
      case 0x13:
        lVar7 = 0x88;
        break;
      default:
        puVar4 = &state->sp;
        goto LAB_0010cb09;
      case 0x17:
        lVar7 = 0x8c;
        break;
      case 0x1b:
        lVar7 = 0x94;
      }
      goto LAB_0010ce2b;
    }
    break;
  case 1:
    uVar10 = uVar8 >> 4 | uVar2 & 7;
    uVar8 = ((uVar2 & 0x40) >> 3 | 7) & (uint)(uVar1 >> 3);
    uVar2 = (state->cpsr).raw & 0x1f;
    if (uVar8 - 8 < 5 && uVar2 == 0x11) {
      puVar4 = state->highreg_fiq + (uVar8 - 8);
      goto LAB_0010ca52;
    }
    if ((ushort)uVar8 < 0xd) {
      puVar4 = state->r + uVar8;
      goto LAB_0010ca52;
    }
    if ((ushort)uVar8 != 0xe) {
      if (uVar8 != 0xd) {
        puVar4 = &state->pc;
        goto LAB_0010ca52;
      }
      switch(uVar2) {
      case 0x11:
        puVar4 = &state->sp_fiq;
        goto LAB_0010ca52;
      case 0x12:
        lVar7 = 0x90;
        break;
      case 0x13:
        lVar7 = 0x88;
        break;
      default:
        puVar4 = &state->sp;
        goto LAB_0010ca52;
      case 0x17:
        lVar7 = 0x8c;
        break;
      case 0x1b:
        lVar7 = 0x94;
      }
      goto LAB_0010ccaa;
    }
    switch(uVar2) {
    case 0x11:
      puVar4 = &state->lr_fiq;
      goto LAB_0010ca52;
    case 0x12:
      lVar7 = 0xa8;
      break;
    case 0x13:
      lVar7 = 0xa0;
      break;
    default:
      puVar4 = &state->lr;
LAB_0010ca52:
      uVar8 = *puVar4;
      if (uVar10 - 8 < 5 && uVar2 == 0x11) {
        puVar4 = state->highreg_fiq + (uVar10 - 8);
        goto LAB_0010cd1a;
      }
      goto LAB_0010ccad;
    case 0x17:
      lVar7 = 0xa4;
      break;
    case 0x1b:
      lVar7 = 0xac;
    }
LAB_0010ccaa:
    uVar8 = *(uint *)((long)state->r + lVar7 + -0x38);
LAB_0010ccad:
    if ((ushort)uVar10 < 0xd) {
      puVar4 = state->r + uVar10;
    }
    else if (uVar10 == 0xe) {
      switch(uVar2) {
      case 0x11:
        puVar4 = &state->lr_fiq;
        break;
      case 0x12:
        puVar4 = &state->lr_irq;
        break;
      case 0x13:
        puVar4 = &state->lr_svc;
        break;
      default:
        puVar4 = &state->lr;
        break;
      case 0x17:
        puVar4 = &state->lr_abt;
        break;
      case 0x1b:
        puVar4 = &state->lr_und;
      }
    }
    else if (uVar10 == 0xd) {
      switch(uVar2) {
      case 0x11:
        puVar4 = &state->sp_fiq;
        break;
      case 0x12:
        puVar4 = &state->sp_irq;
        break;
      case 0x13:
        puVar4 = &state->sp_svc;
        break;
      default:
        puVar4 = &state->sp;
        break;
      case 0x17:
        puVar4 = &state->sp_abt;
        break;
      case 0x1b:
        puVar4 = &state->sp_und;
      }
    }
    else {
      puVar4 = &state->pc;
    }
LAB_0010cd1a:
    uVar2 = *puVar4;
    uVar10 = uVar2 - uVar8;
    (state->cpsr).raw =
         (~(uVar8 ^ uVar10) & (uVar2 ^ uVar8)) >> 3 & 0x10000000 |
         (state->cpsr).raw & 0xcfffffff | (uint)(uVar8 <= uVar2) << 0x1d;
    psVar6 = get_psr(state);
    psVar6->raw = uVar10 & 0x80000000 | (uint)(uVar10 == 0) << 0x1e | psVar6->raw & 0x3fffffff;
    return;
  case 2:
    uVar12 = uVar8 >> 4 | uVar2 & 7;
    uVar10 = ((uVar2 & 0x40) >> 3 | 7) & (uint)(uVar1 >> 3);
    uVar8 = (state->cpsr).raw;
    uVar2 = uVar8 & 0x1f;
    if (uVar10 - 8 < 5 && uVar2 == 0x11) {
      puVar4 = state->highreg_fiq + (uVar10 - 8);
    }
    else if ((ushort)uVar10 < 0xd) {
      puVar4 = state->r + uVar10;
    }
    else if ((ushort)uVar10 == 0xe) {
      switch(uVar2) {
      case 0x11:
        puVar4 = &state->lr_fiq;
        break;
      case 0x12:
        puVar4 = &state->lr_irq;
        break;
      case 0x13:
        puVar4 = &state->lr_svc;
        break;
      default:
        puVar4 = &state->lr;
        break;
      case 0x17:
        puVar4 = &state->lr_abt;
        break;
      case 0x1b:
        puVar4 = &state->lr_und;
      }
    }
    else if (uVar10 == 0xd) {
      switch(uVar2) {
      case 0x11:
        puVar4 = &state->sp_fiq;
        break;
      case 0x12:
        puVar4 = &state->sp_irq;
        break;
      case 0x13:
        puVar4 = &state->sp_svc;
        break;
      default:
        puVar4 = &state->sp;
        break;
      case 0x17:
        puVar4 = &state->sp_abt;
        break;
      case 0x1b:
        puVar4 = &state->sp_und;
      }
    }
    else {
      puVar4 = &state->pc;
    }
    uVar10 = *puVar4;
    if (uVar12 == 0xf) goto LAB_0010cf35;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar12,(ulong)uVar10);
      uVar8 = (state->cpsr).raw;
    }
    if (4 < uVar12 - 8 || (uVar8 & 0x1f) != 0x11) {
      if (0xc < (ushort)uVar12) {
        iVar3 = (uVar8 & 0x1f) - 0x11;
        if (uVar12 != 0xd) {
          switch(iVar3) {
          case 0:
            goto switchD_0010cb54_caseD_0;
          case 1:
            goto switchD_0010cb54_caseD_1;
          case 2:
            goto switchD_0010cb54_caseD_2;
          default:
            goto switchD_0010cb54_caseD_3;
          case 6:
            goto switchD_0010cb54_caseD_6;
          case 10:
            goto switchD_0010cb54_caseD_a;
          }
        }
        switch(iVar3) {
        case 0:
          goto switchD_0010cb00_caseD_0;
        case 1:
          goto switchD_0010cb00_caseD_1;
        case 2:
          goto switchD_0010cb00_caseD_2;
        default:
          goto switchD_0010cb00_caseD_3;
        case 6:
          goto switchD_0010cb00_caseD_6;
        case 10:
          goto switchD_0010cb00_caseD_a;
        }
      }
      goto LAB_0010ce95;
    }
    uVar5 = (ulong)(uVar12 - 8);
    goto LAB_0010ce88;
  case 3:
switchD_0010c6c3_caseD_3:
    if ((short)uVar8 == 0) {
      if ((uVar1 & 0x40) == 0) {
        puVar4 = state->r + (uVar1 >> 3 & 7);
      }
      else {
        uVar8 = uVar1 >> 3 & 0xf;
        uVar2 = (state->cpsr).raw & 0x1f;
        if (uVar8 - 8 < 5 && uVar2 == 0x11) {
          puVar4 = state->highreg_fiq + (uVar8 - 8);
        }
        else if ((ushort)uVar8 < 0xd) {
          puVar4 = state->r + uVar8;
        }
        else if ((ushort)uVar8 == 0xe) {
          switch(uVar2) {
          case 0x11:
            puVar4 = &state->lr_fiq;
            break;
          case 0x12:
            puVar4 = &state->lr_irq;
            break;
          case 0x13:
            puVar4 = &state->lr_svc;
            break;
          default:
            puVar4 = &state->lr;
            break;
          case 0x17:
            puVar4 = &state->lr_abt;
            break;
          case 0x1b:
            puVar4 = &state->lr_und;
          }
        }
        else if (uVar8 == 0xd) {
          switch(uVar2) {
          case 0x11:
            puVar4 = &state->sp_fiq;
            break;
          case 0x12:
            puVar4 = &state->sp_irq;
            break;
          case 0x13:
            puVar4 = &state->sp_svc;
            break;
          default:
            puVar4 = &state->sp;
            break;
          case 0x17:
            puVar4 = &state->sp_abt;
            break;
          case 0x1b:
            puVar4 = &state->sp_und;
          }
        }
        else {
          puVar4 = &state->pc;
        }
      }
      uVar2 = *puVar4;
      if (((1 < gba_log_verbosity) &&
          (printf("\x1b[0;36m[INFO]  Hold on to your (high register operations) hats, we\'re jumping to 0x%02X\n\x1b[0;m"
                  ,(ulong)uVar2), (uVar2 & 1) == 0)) && (2 < gba_log_verbosity)) {
        puts("[DEBUG] REALLY hang on, we\'re exiting THUMB mode!");
      }
      goto LAB_0010cf70;
    }
LAB_0010d09a:
    high_register_operations_cold_1();
    goto LAB_0010d09f;
  }
  switch(uVar2) {
  case 0x11:
    puVar4 = &state->lr_fiq;
    goto LAB_0010cb09;
  case 0x12:
    lVar7 = 0xa8;
    break;
  case 0x13:
    lVar7 = 0xa0;
    break;
  default:
    puVar4 = &state->lr;
LAB_0010cb09:
    uVar11 = *puVar4;
    uVar10 = uVar12 - 8;
    uVar5 = (ulong)uVar10;
    bVar13 = uVar10 < 5;
    if (!bVar13 || uVar2 != 0x11) goto LAB_0010ce3a;
    uVar10 = uVar11 + state->highreg_fiq[uVar10];
    if (uVar12 == 0xf) goto LAB_0010cf35;
    goto LAB_0010ce4e;
  case 0x17:
    lVar7 = 0xa4;
    break;
  case 0x1b:
    lVar7 = 0xac;
  }
LAB_0010ce2b:
  uVar11 = *(uint32_t *)((long)state->r + lVar7 + -0x38);
  uVar5 = (ulong)(uVar12 - 8);
  bVar13 = uVar12 - 8 < 5;
LAB_0010ce3a:
  if ((ushort)uVar12 < 0xd) {
    puVar4 = state->r + uVar12;
  }
  else if (uVar12 == 0xe) {
    switch(uVar2) {
    case 0x11:
      puVar4 = &state->lr_fiq;
      break;
    case 0x12:
      puVar4 = &state->lr_irq;
      break;
    case 0x13:
      puVar4 = &state->lr_svc;
      break;
    default:
      puVar4 = &state->lr;
      break;
    case 0x17:
      puVar4 = &state->lr_abt;
      break;
    case 0x1b:
      puVar4 = &state->lr_und;
    }
  }
  else {
    if (uVar12 != 0xd) {
      uVar10 = uVar11 + state->pc;
LAB_0010cf35:
      uVar2 = uVar10 | 1;
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",0xf,(ulong)uVar2);
        uVar8 = (state->cpsr).raw;
      }
      if ((uVar8 & 0x20) == 0) {
        uVar2 = uVar10 & 0xfffffffe;
      }
LAB_0010cf70:
      set_pc(state,uVar2);
      return;
    }
    switch(uVar2) {
    case 0x11:
      puVar4 = &state->sp_fiq;
      break;
    case 0x12:
      puVar4 = &state->sp_irq;
      break;
    case 0x13:
      puVar4 = &state->sp_svc;
      break;
    default:
      puVar4 = &state->sp;
      break;
    case 0x17:
      puVar4 = &state->sp_abt;
      break;
    case 0x1b:
      puVar4 = &state->sp_und;
    }
  }
  uVar10 = uVar11 + *puVar4;
LAB_0010ce4e:
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar12,(ulong)uVar10);
    uVar8 = (state->cpsr).raw;
  }
  if ((bool)(bVar13 ^ 1U | (uVar8 & 0x1f) != 0x11)) {
    if ((ushort)uVar12 < 0xd) {
LAB_0010ce95:
      state->r[uVar12] = uVar10;
    }
    else {
      iVar3 = (uVar8 & 0x1f) - 0x11;
      if (uVar12 == 0xd) {
        switch(iVar3) {
        case 0:
switchD_0010cb00_caseD_0:
          state->sp_fiq = uVar10;
          break;
        case 1:
switchD_0010cb00_caseD_1:
          state->sp_irq = uVar10;
          break;
        case 2:
switchD_0010cb00_caseD_2:
          state->sp_svc = uVar10;
          break;
        default:
switchD_0010cb00_caseD_3:
          state->sp = uVar10;
          break;
        case 6:
switchD_0010cb00_caseD_6:
          state->sp_abt = uVar10;
          break;
        case 10:
switchD_0010cb00_caseD_a:
          state->sp_und = uVar10;
        }
      }
      else {
        switch(iVar3) {
        case 0:
switchD_0010cb54_caseD_0:
          state->lr_fiq = uVar10;
          break;
        case 1:
switchD_0010cb54_caseD_1:
          state->lr_irq = uVar10;
          break;
        case 2:
switchD_0010cb54_caseD_2:
          state->lr_svc = uVar10;
          break;
        default:
switchD_0010cb54_caseD_3:
          state->lr = uVar10;
          break;
        case 6:
switchD_0010cb54_caseD_6:
          state->lr_abt = uVar10;
          break;
        case 10:
switchD_0010cb54_caseD_a:
          state->lr_und = uVar10;
        }
      }
    }
  }
  else {
LAB_0010ce88:
    state->highreg_fiq[uVar5] = uVar10;
  }
  return;
}

Assistant:

void high_register_operations(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    high_register_operations_t* instr = &thminstr->HIGH_REGISTER_OPERATIONS;
    if (instr->h1 == 0 && instr->h2 == 0) {
        unimplemented(instr->opcode == 0b00, "Invalid flag combination!")
        unimplemented(instr->opcode == 0b01, "Invalid flag combination!")
        unimplemented(instr->opcode == 0b10, "Invalid flag combination!")
    }
    switch (instr->opcode) {
        case 0b00: { // ADD
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word rsdata = get_register(state, adj_rs);
            word rddata = get_register(state, adj_rd);
            word result = rsdata + rddata;
            if (adj_rd == REG_PC) {
                result |= 1; // Set thumb mode bit
            }
            set_register(state, adj_rd, result);
            break;
        }
        case 0b01: { // CMP (only one that sets condition codes in this group)
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word rsdata = get_register(state, adj_rs);
            word rddata = get_register(state, adj_rd);
            word result = rddata - rsdata;
            set_flags_sub(state, rddata, rsdata, result);
            set_flags_nz(state, result);
            break;
        }
        case 0b10: { // MOV
            int adj_rd = instr->h1 ? instr->rdhd + 8 : instr->rdhd;
            int adj_rs = instr->h2 ? instr->rshs + 8 : instr->rshs;
            word source_data = get_register(state, adj_rs);
            if (adj_rd == REG_PC) {
                source_data |= 1; // Set thumb mode bit
            }
            set_register(state, adj_rd, source_data);
            break;
        }
        case 0b11: { // BX
            unimplemented(instr->h1 == 1, "INVALID setting for h1")
            word newpc;
            if (instr->h2) {
                newpc = get_register(state, instr->rshs + 8);
            } else {
                newpc = get_register(state, instr->rshs);
            }

            bool thumb = newpc & 1u;
            loginfo("Hold on to your (high register operations) hats, we're jumping to 0x%02X", newpc)
            if (!thumb) logdebug("REALLY hang on, we're exiting THUMB mode!")
            set_pc(state, newpc);
            break;
        }
    }
}